

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O0

Vector3d * RigidBodyDynamics::CalcAngularVelocityfromMatrix(Matrix3d *RotMat)

{
  CoeffReturnType pdVar1;
  Vector3d *in_RDI;
  RealScalar RVar2;
  Scalar SVar3;
  double dVar4;
  double row;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *this;
  Vector3_t *this_00;
  double PI;
  double preFactor;
  Vector3d l;
  double tol;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff18;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *in_stack_ffffffffffffff20;
  double *v2;
  StorageBaseType *matrix;
  double *in_stack_ffffffffffffff68;
  Vector3_t *in_stack_ffffffffffffff70;
  
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
            (in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18,0x86083c);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
            (in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18,0x86085d);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18,0x860886);
  v2 = (double *)*pdVar1;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
            (in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18,0x8608a6);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18,0x8608cf);
  matrix = (StorageBaseType *)*pdVar1;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
            (in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18,0x8608ef);
  Vector3_t::Vector3_t(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(double *)matrix,v2);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_ffffffffffffff18);
  if (1e-12 < RVar2) {
    RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                      (in_stack_ffffffffffffff18);
    SVar3 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::trace
                      ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       in_stack_ffffffffffffff20);
    atan2(RVar2,SVar3 - 1.0);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_ffffffffffffff18);
    Eigen::operator*(in_stack_ffffffffffffff68,matrix);
    Vector3_t::
    Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Vector3_t *)in_stack_ffffffffffffff20,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_ffffffffffffff18);
    return in_RDI;
  }
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18,0x8609e8);
  if ((((*pdVar1 <= 0.0) ||
       (pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           (in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18,0x860a0a),
       *pdVar1 <= 0.0)) ||
      (pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                          (in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18,0x860a2c),
      *pdVar1 <= 0.0)) &&
     (RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                        (in_stack_ffffffffffffff18), 1e-12 <= RVar2)) {
    dVar4 = atan(1.0);
    dVar4 = dVar4 * 4.0;
    row = dVar4 / 2.0;
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
              (in_stack_ffffffffffffff20,(Index)row,0x860ab8);
    this = (DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)(dVar4 / 2.0);
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                       (this,(Index)row,0x860b00);
    this_00 = (Vector3_t *)((double)this * (*pdVar1 + 1.0));
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                       (this,(Index)row,0x860b49);
    Vector3_t::Vector3_t(this_00,(double *)((dVar4 / 2.0) * (*pdVar1 + 1.0)),(double *)matrix,v2);
    return in_RDI;
  }
  Vector3_t::Vector3_t
            ((Vector3_t *)in_stack_ffffffffffffff20,(Vector3_t *)in_stack_ffffffffffffff18);
  return in_RDI;
}

Assistant:

RBDL_DLLAPI
Vector3d CalcAngularVelocityfromMatrix (
    const Matrix3d &RotMat
    ) {
  double tol = 1e-12;

  Vector3d l = Vector3d (RotMat(2,1) - RotMat(1,2), RotMat(0,2) - RotMat(2,0), RotMat(1,0) - RotMat(0,1));
  if(l.norm() > tol){
    double preFactor = atan2(l.norm(),(RotMat.trace() - 1.0))/l.norm();
    return preFactor*l;
  }
  else if((RotMat(0,0)>0 && RotMat(1,1)>0 && RotMat(2,2) > 0) || l.norm() < tol){
    return Vector3dZero;
  }
  else{
    double PI = atan(1)*4.0;
    return Vector3d (PI/2*(RotMat(0,0) + 1.0),PI/2*(RotMat(1,1) + 1.0),PI/2*(RotMat(2,2) + 1.0));
  }
}